

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O3

void __thiscall kj::_::XThreadPaf::FulfillScope::~FulfillScope(FulfillScope *this)

{
  Mutex *this_00;
  XThreadPaf *pXVar1;
  Maybe<kj::_::XThreadPaf_&> *pMVar2;
  long *plVar3;
  Locked<kj::Executor::Impl::State> lock;
  
  if (this->obj != (XThreadPaf *)0x0) {
    this_00 = (Mutex *)(((this->obj->executor).ptr)->impl).ptr;
    Mutex::lock(this_00);
    pXVar1 = this->obj;
    if ((pXVar1->link).prev != (Maybe<kj::_::XThreadPaf_&> *)0x0) {
      throwDoubleAdd();
    }
    pMVar2 = (Maybe<kj::_::XThreadPaf_&> *)this_00[5].waitersTail;
    pMVar2->ptr = pXVar1;
    (pXVar1->link).prev = pMVar2;
    this_00[5].waitersTail = (Maybe<kj::_::Mutex::Waiter_&> *)&pXVar1->link;
    *(long *)(this_00 + 6) = *(long *)(this_00 + 6) + 1;
    pXVar1->state = 2;
    if ((*(long **)(this_00 + 1) != (long *)0x0) &&
       (plVar3 = (long *)**(long **)(this_00 + 1), plVar3 != (long *)0x0)) {
      (**(code **)(*plVar3 + 0x18))();
    }
    Mutex::unlock(this_00,EXCLUSIVE,(Waiter *)0x0);
  }
  return;
}

Assistant:

XThreadPaf::FulfillScope::~FulfillScope() noexcept(false) {
  if (obj != nullptr) {
    auto lock = obj->executor->impl->state.lockExclusive();
    lock->fulfilled.add(*obj);
    __atomic_store_n(&obj->state, FULFILLED, __ATOMIC_RELEASE);
    KJ_IF_SOME(l, lock->loop) {
      KJ_IF_SOME(p, l.port) {
        // TODO(perf): It's annoying we have to call wake() with the lock held, but we have to
        //   prevent the destination EventLoop from being destroyed first.
        p.wake();
      }
    } else {
      // The thread which called kj::newPromiseAndCrossThreadFulfiller<T>() apparently exited its
      // own event loop without canceling the cross-thread promise first. Whoever now owns the
      // promise can only do one thing with it safely: destroy it.
    }
  }
}